

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O2

char * __thiscall
ASDCP::MXF::J2KExtendedCapabilitiesType::EncodeString
          (J2KExtendedCapabilitiesType *this,char *str_buf,ui32_t buf_len)

{
  pointer pAVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  
  pcVar4 = str_buf;
  if ((0x60 < buf_len) && (this->Pcap != 0)) {
    lVar3 = 8;
    for (uVar2 = 0;
        pAVar1 = (this->Ccap).
                 super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                 .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                 super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar2 < (ulong)((long)(this->Ccap).
                              super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                              .
                              super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                              .
                              super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4);
        uVar2 = uVar2 + 1) {
      snprintf(pcVar4,4,"%02hx.",
               (ulong)*(ushort *)((long)&(pAVar1->super_IArchive)._vptr_IArchive + lVar3));
      lVar3 = lVar3 + 0x10;
      pcVar4 = pcVar4 + 3;
    }
    pcVar4 = str_buf + 0x5f;
  }
  *pcVar4 = '\0';
  return str_buf;
}

Assistant:

const char*
ASDCP::MXF::J2KExtendedCapabilitiesType::EncodeString(char* str_buf, ui32_t buf_len) const
{
  const int str_len = ( sizeof(ui16_t) + 1 ) * JP2K::MaxCapabilities;

  if ( Pcap != 0 && buf_len > str_len )
    {
      for ( size_t i = 0; i < Ccap.size(); ++i )
        {
	  snprintf(str_buf+(i*3), 4, "%02hx.", Ccap[i].value);
        }

      str_buf[str_len-1] = 0;
    }
  else
    {
      str_buf[0] = 0;
    }

  return str_buf;
}